

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void config_test(void)

{
  fdb_file_info finfo;
  int r;
  char fname [256];
  size_t bcache_space_used;
  int i;
  int nfiles;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffa28;
  size_t in_stack_fffffffffffffa48;
  void *in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffa58;
  fdb_file_info *in_stack_fffffffffffffa60;
  fdb_kvs_handle *in_stack_fffffffffffffa68;
  undefined1 local_578 [248];
  undefined1 local_480 [80];
  fdb_kvs_config *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  fdb_kvs_handle **in_stack_fffffffffffffbe0;
  fdb_file_handle *in_stack_fffffffffffffbe8;
  fdb_config *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  fdb_file_handle **in_stack_fffffffffffffc58;
  undefined1 local_388 [252];
  int local_28c;
  char local_288 [256];
  size_t local_188;
  uint local_180;
  uint local_17c;
  undefined1 local_160 [4];
  int local_15c;
  undefined8 local_158;
  undefined8 local_f0;
  fdb_status local_64;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_17c = 4;
  local_28c = system("rm -rf  dummy* > errorlog.txt");
  local_188 = fdb_get_buffer_cache_used();
  if (local_188 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x18a);
    config_test::__test_pass = 0;
    if (local_188 != 0) {
      __assert_fail("bcache_space_used == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x18a,"void config_test()");
    }
  }
  fdb_get_default_config();
  memcpy(local_160,local_388,0xf8);
  local_158 = 0xffffffffffffffff;
  local_64 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48)
  ;
  if (local_64 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,399);
    config_test::__test_pass = 0;
    if (local_64 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) {
      __assert_fail("status == FDB_RESULT_TOO_BIG_BUFFER_CACHE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,399,"void config_test()");
    }
  }
  fdb_get_default_config();
  memcpy(local_160,local_480,0xf8);
  local_f0 = 0x78;
  local_64 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48)
  ;
  if (local_64 != FDB_RESULT_INVALID_CONFIG) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x194);
    config_test::__test_pass = 0;
    if (local_64 != FDB_RESULT_INVALID_CONFIG) {
      __assert_fail("status == FDB_RESULT_INVALID_CONFIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x194,"void config_test()");
    }
  }
  fdb_get_default_config();
  memcpy(local_160,local_578,0xf8);
  fdb_get_default_kvs_config();
  local_180 = local_17c;
  do {
    if (local_180 == 0) {
      local_64 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                          in_stack_fffffffffffffc48);
      if (local_64 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1af);
        config_test::__test_pass = 0;
        if (local_64 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x1af,"void config_test()");
        }
      }
      local_64 = fdb_kvs_open(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                              in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      if (local_64 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b1);
        config_test::__test_pass = 0;
        if (local_64 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x1b1,"void config_test()");
        }
      }
      local_64 = fdb_set_kv(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                            in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                            in_stack_fffffffffffffa48);
      if (local_64 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b3);
        config_test::__test_pass = 0;
        if (local_64 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x1b3,"void config_test()");
        }
      }
      local_188 = fdb_get_buffer_cache_used();
      if (local_188 != (uint)(local_15c << 3)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1b9);
        config_test::__test_pass = 0;
        if (local_188 != (uint)(local_15c << 3)) {
          __assert_fail("bcache_space_used == fconfig.blocksize * 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x1b9,"void config_test()");
        }
      }
      fdb_close(in_stack_fffffffffffffa28);
      fdb_shutdown();
      memleak_end();
      if (config_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","forestdb config test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","forestdb config test");
      }
      return;
    }
    sprintf(local_288,"dummy%d",(ulong)local_180);
    local_64 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                        in_stack_fffffffffffffc48);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x19b);
      config_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x19b,"void config_test()");
      }
    }
    local_64 = fdb_kvs_open(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                            in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x19d);
      config_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x19d,"void config_test()");
      }
    }
    local_188 = fdb_get_buffer_cache_used();
    local_64 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffa68,
                                 in_stack_fffffffffffffa60);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a3);
      config_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1a3,"void config_test()");
      }
    }
    if (in_stack_fffffffffffffa50 != (void *)(ulong)(uint)(local_15c * 7)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a6);
      config_test::__test_pass = 0;
      if (in_stack_fffffffffffffa50 != (void *)(ulong)(uint)(local_15c * 7)) {
        __assert_fail("finfo.file_size == fconfig.blocksize * 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1a6,"void config_test()");
      }
    }
    if (local_188 != (uint)(local_15c << 1)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1a8);
      config_test::__test_pass = 0;
      if (local_188 != (uint)(local_15c << 1)) {
        __assert_fail("bcache_space_used == fconfig.blocksize * 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1a8,"void config_test()");
      }
    }
    local_64 = fdb_close(in_stack_fffffffffffffa28);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1ab);
      config_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1ab,"void config_test()");
      }
    }
    local_180 = local_180 - 1;
  } while( true );
}

Assistant:

void config_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int nfiles = 4;
    int i;
    size_t bcache_space_used;
    char fname[256];

    // remove previous dummy test files
    int r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    bcache_space_used = fdb_get_buffer_cache_used();
    TEST_CHK(bcache_space_used == 0);

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= (uint64_t) -1;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_TOO_BIG_BUFFER_CACHE);

    fconfig = fdb_get_default_config();
    fconfig.max_writer_lock_prob = 120;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    for (i = nfiles; i; --i) {
        sprintf(fname, "dummy%d", i);
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        bcache_space_used = fdb_get_buffer_cache_used();

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);
        // Buffercache must only have KV name header + stale-tree root
        TEST_CHK(bcache_space_used == fconfig.blocksize * 2);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_open(&dbfile, fname, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(db, (void*)"key", 3, (void*)"body", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    bcache_space_used = fdb_get_buffer_cache_used();

    // Since V3 magic number, 8 blocks are used:
    // 7 blocks created eariler + document block for KV pair
    TEST_CHK(bcache_space_used == fconfig.blocksize * 8);

    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("forestdb config test");
}